

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_widget_is_mouse_clicked(nk_context *ctx,nk_buttons btn)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_rect rect;
  int iVar3;
  int iVar4;
  nk_rect bounds;
  nk_rect local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x49b5,"int nk_widget_is_mouse_clicked(struct nk_context *, enum nk_buttons)");
  }
  pnVar1 = ctx->current;
  if (pnVar1 != (nk_window *)0x0) {
    iVar4 = 0;
    iVar3 = 0;
    if (ctx->active == pnVar1) {
      pnVar2 = pnVar1->layout;
      local_58 = ZEXT416((uint)(pnVar2->clip).y);
      local_68 = ZEXT416((uint)(pnVar2->clip).h);
      local_48 = ZEXT416((uint)(float)(int)(pnVar2->clip).x);
      local_38 = ZEXT416((uint)(float)(int)(pnVar2->clip).w);
      nk_layout_peek(&local_78,ctx);
      iVar3 = iVar4;
      if ((local_78.x <= (float)local_38._0_4_ + (float)local_48._0_4_) &&
         ((float)local_48._0_4_ <= local_78.x + local_78.w)) {
        if ((local_78.y <= (float)(int)(float)local_68._0_4_ + (float)(int)(float)local_58._0_4_) &&
           ((float)(int)(float)local_58._0_4_ <= local_78.y + local_78.h)) {
          rect.y = local_78.y;
          rect.x = local_78.x;
          rect.w = local_78.w;
          rect.h = local_78.h;
          iVar3 = nk_input_mouse_clicked(&ctx->input,btn,rect);
        }
      }
    }
    return iVar3;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x49b6,"int nk_widget_is_mouse_clicked(struct nk_context *, enum nk_buttons)");
}

Assistant:

NK_API int
nk_widget_is_mouse_clicked(struct nk_context *ctx, enum nk_buttons btn)
{
    struct nk_rect c, v;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current || ctx->active != ctx->current)
        return 0;

    c = ctx->current->layout->clip;
    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_layout_peek(&bounds, ctx);
    nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
        return 0;
    return nk_input_mouse_clicked(&ctx->input, btn, bounds);
}